

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Velocitizer.cpp
# Opt level: O0

void __thiscall OpenMD::Velocitizer::randomize(Velocitizer *this,RealType temperature)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar5;
  RealType RVar6;
  result_type_conflict rVar7;
  SimInfo *pSVar8;
  int k_1;
  int k;
  normal_distribution<double> normalDistribution;
  StuntDouble *sd;
  Molecule *mol;
  IntegrableObjectIterator ioi;
  MoleculeIterator mi;
  RealType kebar;
  RealType av2;
  RealType jbar;
  RealType vbar;
  Vector3d vdrift;
  int n;
  int m;
  int l;
  Mat3x3d I;
  Vector3d j;
  Vector3d v;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  SimInfo *in_stack_fffffffffffffd70;
  StuntDouble *in_stack_fffffffffffffd78;
  StuntDouble *in_stack_fffffffffffffd80;
  iterator *in_stack_fffffffffffffd88;
  SimInfo *in_stack_fffffffffffffd90;
  Velocitizer *in_stack_fffffffffffffdf0;
  uint local_174;
  undefined1 local_170 [76];
  uint local_124;
  StuntDouble *local_100;
  SimInfo *local_f8;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_f0;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_e8;
  double local_e0;
  double local_d8;
  SimInfo *local_d0;
  double local_c8;
  uint local_94;
  uint local_90;
  uint local_8c;
  Velocitizer *in_stack_ffffffffffffffa0;
  Vector<double,_3U> local_40;
  Vector<double,_3U> local_28;
  double local_10;
  
  local_10 = in_XMM0_Qa;
  Vector3<double>::Vector3((Vector3<double> *)0x31dad5);
  Vector3<double>::Vector3((Vector3<double> *)0x31dae2);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x31daef);
  Vector3<double>::Vector3((Vector3<double> *)0x31dafc);
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_e8);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_f0);
  std::normal_distribution<double>::normal_distribution
            ((normal_distribution<double> *)in_stack_fffffffffffffd80,
             (result_type_conflict)in_stack_fffffffffffffd78,
             (result_type_conflict)in_stack_fffffffffffffd70);
  iVar2 = SimInfo::getNdfRaw(*(SimInfo **)(in_RDI + 8));
  iVar3 = SimInfo::getNdf(in_stack_fffffffffffffd70);
  local_e0 = (local_10 * 8.31451e-07 * (double)iVar2) / ((double)iVar3 + (double)iVar3);
  local_f8 = (SimInfo *)
             SimInfo::beginMolecule
                       (in_stack_fffffffffffffd90,(MoleculeIterator *)in_stack_fffffffffffffd88);
  while (local_f8 != (SimInfo *)0x0) {
    local_100 = Molecule::beginIntegrableObject
                          ((Molecule *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    while (local_100 != (StuntDouble *)0x0) {
      dVar5 = local_e0 + local_e0;
      RVar6 = StuntDouble::getMass(local_100);
      local_d8 = dVar5 / RVar6;
      local_c8 = sqrt(local_d8);
      for (local_124 = 0; dVar5 = local_c8, (int)local_124 < 3; local_124 = local_124 + 1) {
        std::
        __shared_ptr_access<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)in_stack_fffffffffffffd70);
        rVar7 = std::normal_distribution<double>::operator()
                          ((normal_distribution<double> *)in_stack_fffffffffffffd70,
                           (RandNumGen *)
                           CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
        pdVar4 = Vector<double,_3U>::operator[](&local_28,local_124);
        *pdVar4 = dVar5 * rVar7;
      }
      StuntDouble::setVel(in_stack_fffffffffffffd80,(Vector3d *)in_stack_fffffffffffffd78);
      bVar1 = StuntDouble::isDirectional((StuntDouble *)in_stack_fffffffffffffd70);
      if (bVar1) {
        (*local_100->_vptr_StuntDouble[5])(local_170);
        SquareMatrix3<double>::operator=
                  ((SquareMatrix3<double> *)in_stack_fffffffffffffd70,
                   (SquareMatrix3<double> *)
                   CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
        SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x31de02);
        bVar1 = StuntDouble::isLinear(local_100);
        if (bVar1) {
          local_8c = StuntDouble::linearAxis(local_100);
          local_90 = local_8c + 1 + ((int)(local_8c + 1) / 3) * -3;
          local_94 = local_8c + 2 + ((int)(local_8c + 2) / 3) * -3;
          pdVar4 = Vector<double,_3U>::operator[](&local_40,local_8c);
          *pdVar4 = 0.0;
          dVar5 = local_e0 + local_e0;
          pdVar4 = RectMatrix<double,_3U,_3U>::operator()
                             ((RectMatrix<double,_3U,_3U> *)&stack0xffffffffffffff78,local_90,
                              local_90);
          in_stack_fffffffffffffdf0 = (Velocitizer *)sqrt(dVar5 * *pdVar4);
          local_d0 = (SimInfo *)in_stack_fffffffffffffdf0;
          std::
          __shared_ptr_access<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator*((__shared_ptr_access<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)in_stack_fffffffffffffd70);
          rVar7 = std::normal_distribution<double>::operator()
                            ((normal_distribution<double> *)in_stack_fffffffffffffd70,
                             (RandNumGen *)
                             CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
          dVar5 = (double)in_stack_fffffffffffffdf0 * rVar7;
          pdVar4 = Vector<double,_3U>::operator[](&local_40,local_90);
          *pdVar4 = dVar5;
          dVar5 = local_e0 + local_e0;
          pdVar4 = RectMatrix<double,_3U,_3U>::operator()
                             ((RectMatrix<double,_3U,_3U> *)&stack0xffffffffffffff78,local_94,
                              local_94);
          pSVar8 = (SimInfo *)sqrt(dVar5 * *pdVar4);
          local_d0 = pSVar8;
          std::
          __shared_ptr_access<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator*((__shared_ptr_access<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)in_stack_fffffffffffffd70);
          rVar7 = std::normal_distribution<double>::operator()
                            ((normal_distribution<double> *)in_stack_fffffffffffffd70,
                             (RandNumGen *)
                             CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
          pdVar4 = Vector<double,_3U>::operator[](&local_40,local_94);
          *pdVar4 = (double)pSVar8 * rVar7;
        }
        else {
          for (local_174 = 0; (int)local_174 < 3; local_174 = local_174 + 1) {
            dVar5 = local_e0 + local_e0;
            pdVar4 = RectMatrix<double,_3U,_3U>::operator()
                               ((RectMatrix<double,_3U,_3U> *)&stack0xffffffffffffff78,local_174,
                                local_174);
            in_stack_fffffffffffffd90 = (SimInfo *)sqrt(dVar5 * *pdVar4);
            local_d0 = in_stack_fffffffffffffd90;
            std::
            __shared_ptr_access<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)in_stack_fffffffffffffd70);
            rVar7 = std::normal_distribution<double>::operator()
                              ((normal_distribution<double> *)in_stack_fffffffffffffd70,
                               (RandNumGen *)
                               CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
            in_stack_fffffffffffffd80 = (StuntDouble *)((double)in_stack_fffffffffffffd90 * rVar7);
            in_stack_fffffffffffffd88 =
                 (iterator *)Vector<double,_3U>::operator[](&local_40,local_174);
            in_stack_fffffffffffffd88->_M_current = (StuntDouble **)in_stack_fffffffffffffd80;
          }
        }
        StuntDouble::setJ(in_stack_fffffffffffffd80,(Vector3d *)in_stack_fffffffffffffd78);
      }
      in_stack_fffffffffffffd78 =
           Molecule::nextIntegrableObject
                     ((Molecule *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      local_100 = in_stack_fffffffffffffd78;
    }
    in_stack_fffffffffffffd70 =
         (SimInfo *)
         SimInfo::nextMolecule
                   (in_stack_fffffffffffffd90,(MoleculeIterator *)in_stack_fffffffffffffd88);
    local_f8 = in_stack_fffffffffffffd70;
  }
  removeComDrift(in_stack_fffffffffffffdf0);
  bVar1 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x31e25c);
  if (!bVar1) {
    removeAngularDrift(in_stack_ffffffffffffffa0);
  }
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x31e28a);
  return;
}

Assistant:

void Velocitizer::randomize(RealType temperature) {
    Vector3d v;
    Vector3d j;
    Mat3x3d I;
    int l, m, n;
    Vector3d vdrift;
    RealType vbar;
    RealType jbar;
    RealType av2;
    RealType kebar;

    SimInfo::MoleculeIterator mi;
    Molecule::IntegrableObjectIterator ioi;
    Molecule* mol;
    StuntDouble* sd;

    std::normal_distribution<RealType> normalDistribution {0.0, 1.0};

    kebar = Constants::kB * temperature * info_->getNdfRaw() /
            (2.0 * info_->getNdf());
    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ioi); sd != NULL;
           sd = mol->nextIntegrableObject(ioi)) {
        // uses equipartition theory to solve for vbar in angstrom/fs

        av2  = 2.0 * kebar / sd->getMass();
        vbar = sqrt(av2);

        // picks random velocities from a gaussian distribution
        // centered on vbar

        for (int k = 0; k < 3; k++) {
          v[k] = vbar * normalDistribution(*randNumGen_);
        }
        sd->setVel(v);

        if (sd->isDirectional()) {
          I = sd->getI();

          if (sd->isLinear()) {
            l = sd->linearAxis();
            m = (l + 1) % 3;
            n = (l + 2) % 3;

            j[l] = 0.0;
            jbar = sqrt(2.0 * kebar * I(m, m));
            j[m] = jbar * normalDistribution(*randNumGen_);
            jbar = sqrt(2.0 * kebar * I(n, n));
            j[n] = jbar * normalDistribution(*randNumGen_);
          } else {
            for (int k = 0; k < 3; k++) {
              jbar = sqrt(2.0 * kebar * I(k, k));
              j[k] = jbar * normalDistribution(*randNumGen_);
            }
          }

          sd->setJ(j);
        }
      }
    }

    removeComDrift();

    // Remove angular drift if we are not using periodic boundary
    // conditions:

    if (!globals_->getUsePeriodicBoundaryConditions()) removeAngularDrift();
  }